

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::Parse(Parser *this)

{
  bool bVar1;
  reference pvVar2;
  BaseNode *node;
  reference node_00;
  reference node_01;
  char *szWarn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  allocator<char> local_7c1;
  undefined1 local_7c0 [8];
  string out;
  string local_798;
  Camera local_778;
  allocator<char> local_609;
  string local_608;
  Light local_5e8;
  Dummy local_478;
  allocator<char> local_309;
  string local_308;
  Mesh local_2e8;
  uint local_18;
  int local_14;
  uint fmt;
  int iDepth;
  Parser *this_local;
  
  local_14 = 0;
  _fmt = this;
LAB_00610021:
  do {
    while (*this->filePtr != '*') {
      if (*this->filePtr == '{') {
        local_14 = local_14 + 1;
      }
      else if (*this->filePtr == '}') {
        local_14 = local_14 + -1;
        if (local_14 == 0) {
          this->filePtr = this->filePtr + 1;
          SkipToNextToken(this);
          return;
        }
      }
      else if (*this->filePtr == '\0') {
        return;
      }
LAB_00610782:
      bVar1 = IsLineEnd<char>(*this->filePtr);
      if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = this->filePtr + 1;
    }
    this->filePtr = this->filePtr + 1;
    bVar1 = TokenMatch<char_const>(&this->filePtr,"3DSMAX_ASCIIEXPORT",0x12);
    if (!bVar1) {
      bVar1 = TokenMatch<char_const>(&this->filePtr,"SCENE",5);
      if (bVar1) {
        ParseLV1SceneBlock(this);
      }
      else {
        bVar1 = TokenMatch<char_const>(&this->filePtr,"GROUP",5);
        if (bVar1) {
          Parse(this);
        }
        else {
          bVar1 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_LIST",0xd);
          if (bVar1) {
            ParseLV1MaterialListBlock(this);
          }
          else {
            bVar1 = TokenMatch<char_const>(&this->filePtr,"GEOMOBJECT",10);
            if (bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_308,"UNNAMED",&local_309);
              ASE::Mesh::Mesh(&local_2e8,&local_308);
              std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>::push_back
                        (&this->m_vMeshes,&local_2e8);
              ASE::Mesh::~Mesh(&local_2e8);
              std::__cxx11::string::~string((string *)&local_308);
              std::allocator<char>::~allocator(&local_309);
              pvVar2 = std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>::back
                                 (&this->m_vMeshes);
              ParseLV1ObjectBlock(this,&pvVar2->super_BaseNode);
            }
            else {
              bVar1 = TokenMatch<char_const>(&this->filePtr,"HELPEROBJECT",0xc);
              if (bVar1) {
                Dummy::Dummy(&local_478);
                std::vector<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>::push_back
                          (&this->m_vDummies,&local_478);
                Dummy::~Dummy(&local_478);
                node = &std::vector<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>::back
                                  (&this->m_vDummies)->super_BaseNode;
                ParseLV1ObjectBlock(this,node);
              }
              else {
                bVar1 = TokenMatch<char_const>(&this->filePtr,"LIGHTOBJECT",0xb);
                if (bVar1) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_608,"UNNAMED",&local_609);
                  ASE::Light::Light(&local_5e8,&local_608);
                  std::vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>::push_back
                            (&this->m_vLights,&local_5e8);
                  ASE::Light::~Light(&local_5e8);
                  std::__cxx11::string::~string((string *)&local_608);
                  std::allocator<char>::~allocator(&local_609);
                  node_00 = std::vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>::
                            back(&this->m_vLights);
                  ParseLV1ObjectBlock(this,&node_00->super_BaseNode);
                }
                else {
                  bVar1 = TokenMatch<char_const>(&this->filePtr,"CAMERAOBJECT",0xc);
                  if (bVar1) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_798,"UNNAMED",
                               (allocator<char> *)(out.field_2._M_local_buf + 0xf));
                    Camera::Camera(&local_778,&local_798);
                    std::vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>::
                    push_back(&this->m_vCameras,&local_778);
                    Camera::~Camera(&local_778);
                    std::__cxx11::string::~string((string *)&local_798);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)(out.field_2._M_local_buf + 0xf));
                    node_01 = std::vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>
                              ::back(&this->m_vCameras);
                    ParseLV1ObjectBlock(this,&node_01->super_BaseNode);
                  }
                  else {
                    bVar1 = TokenMatch<char_const>(&this->filePtr,"COMMENT",7);
                    if (!bVar1) {
                      if ((this->iFileFormat < 200) &&
                         (bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_SOFTSKINVERTS",0x12),
                         bVar1)) {
                        ParseLV1SoftSkinBlock(this);
                      }
                      goto LAB_00610782;
                    }
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)local_7c0,"<unknown>",&local_7c1);
                    std::allocator<char>::~allocator(&local_7c1);
                    ParseString(this,(string *)local_7c0,"*COMMENT");
                    std::operator+(&local_7e8,"Comment: ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_7c0);
                    szWarn = (char *)std::__cxx11::string::c_str();
                    LogInfo(this,szWarn);
                    std::__cxx11::string::~string((string *)&local_7e8);
                    std::__cxx11::string::~string((string *)local_7c0);
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_00610021;
    }
    ParseLV4MeshLong(this,&local_18);
    if (200 < local_18) {
      LogWarning(this,
                 "Unknown file format version: *3DSMAX_ASCIIEXPORT should                                be <= 200"
                );
    }
    if (local_18 != 0) {
      this->iFileFormat = local_18;
    }
  } while( true );
}

Assistant:

void Parser::Parse()
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Version should be 200. Validate this ...
            if (TokenMatch(filePtr,"3DSMAX_ASCIIEXPORT",18))
            {
                unsigned int fmt;
                ParseLV4MeshLong(fmt);

                if (fmt > 200)
                {
                    LogWarning("Unknown file format version: *3DSMAX_ASCIIEXPORT should \
                               be <= 200");
                }
                // *************************************************************
                // - fmt will be 0 if we're unable to read the version number
                // there are some faulty files without a version number ...
                // in this case we'll guess the exact file format by looking
                // at the file extension (ASE, ASK, ASC)
                // *************************************************************

                if ( fmt ) {
                    iFileFormat = fmt;
                }
                continue;
            }
            // main scene information
            if (TokenMatch(filePtr,"SCENE",5))
            {
                ParseLV1SceneBlock();
                continue;
            }
            // "group" - no implementation yet, in facte
            // we're just ignoring them for the moment
            if (TokenMatch(filePtr,"GROUP",5))
            {
                Parse();
                continue;
            }
            // material list
            if (TokenMatch(filePtr,"MATERIAL_LIST",13))
            {
                ParseLV1MaterialListBlock();
                continue;
            }
            // geometric object (mesh)
            if (TokenMatch(filePtr,"GEOMOBJECT",10))

            {
                m_vMeshes.push_back(Mesh("UNNAMED"));
                ParseLV1ObjectBlock(m_vMeshes.back());
                continue;
            }
            // helper object = dummy in the hierarchy
            if (TokenMatch(filePtr,"HELPEROBJECT",12))

            {
                m_vDummies.push_back(Dummy());
                ParseLV1ObjectBlock(m_vDummies.back());
                continue;
            }
            // light object
            if (TokenMatch(filePtr,"LIGHTOBJECT",11))

            {
                m_vLights.push_back(Light("UNNAMED"));
                ParseLV1ObjectBlock(m_vLights.back());
                continue;
            }
            // camera object
            if (TokenMatch(filePtr,"CAMERAOBJECT",12))
            {
                m_vCameras.push_back(Camera("UNNAMED"));
                ParseLV1ObjectBlock(m_vCameras.back());
                continue;
            }
            // comment - print it on the console
            if (TokenMatch(filePtr,"COMMENT",7))
            {
                std::string out = "<unknown>";
                ParseString(out,"*COMMENT");
                LogInfo(("Comment: " + out).c_str());
                continue;
            }
            // ASC bone weights
            if (AI_ASE_IS_OLD_FILE_FORMAT() && TokenMatch(filePtr,"MESH_SOFTSKINVERTS",18))
            {
                ParseLV1SoftSkinBlock();
            }
        }
        AI_ASE_HANDLE_TOP_LEVEL_SECTION();
    }
    return;
}